

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O2

void n_array_suite::n_array_just_minus(void)

{
  char input [4];
  reader reader;
  undefined4 local_170;
  char local_16c [4];
  view_type local_168;
  basic_reader<char> local_158;
  
  builtin_strncpy(local_16c,"[-]",4);
  local_168._M_len = strlen(local_16c);
  local_168._M_str = local_16c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_168);
  local_170 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2a3,"void n_array_suite::n_array_just_minus()",&local_168,&local_170);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_168._M_len = CONCAT44(local_168._M_len._4_4_,local_158.decoder.current.code);
  local_170 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2a5,"void n_array_suite::n_array_just_minus()",&local_168,&local_170);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_158.stack);
  return;
}

Assistant:

void n_array_just_minus()
{
    const char input[] = "[-]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}